

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql_statement.hpp
# Opt level: O1

void __thiscall
duckdb::TransactionStatement::TransactionStatement
          (TransactionStatement *this,
          unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>,_true>
          *info)

{
  (this->super_SQLStatement).type = TRANSACTION_STATEMENT;
  (this->super_SQLStatement).stmt_location = 0;
  (this->super_SQLStatement).stmt_length = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_buckets =
       &(this->super_SQLStatement).named_param_map._M_h._M_single_bucket;
  (this->super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
  (this->super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_SQLStatement).named_param_map._M_h._M_element_count = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_SQLStatement).query._M_dataplus._M_p =
       (pointer)&(this->super_SQLStatement).query.field_2;
  (this->super_SQLStatement).query._M_string_length = 0;
  (this->super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__TransactionStatement_0247e778;
  (this->info).
  super_unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::TransactionInfo_*,_std::default_delete<duckdb::TransactionInfo>_>.
  super__Head_base<0UL,_duckdb::TransactionInfo_*,_false>._M_head_impl =
       (info->
       super_unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TransactionInfo_*,_std::default_delete<duckdb::TransactionInfo>_>
       .super__Head_base<0UL,_duckdb::TransactionInfo_*,_false>._M_head_impl;
  (info->super_unique_ptr<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>).
  _M_t.super___uniq_ptr_impl<duckdb::TransactionInfo,_std::default_delete<duckdb::TransactionInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TransactionInfo_*,_std::default_delete<duckdb::TransactionInfo>_>.
  super__Head_base<0UL,_duckdb::TransactionInfo_*,_false>._M_head_impl = (TransactionInfo *)0x0;
  return;
}

Assistant:

explicit SQLStatement(StatementType type) : type(type) {
	}